

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::FilterTemplateToken::~FilterTemplateToken(FilterTemplateToken *this)

{
  FilterTemplateToken *in_RDI;
  
  ~FilterTemplateToken(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

FilterTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && filter)
      : TemplateToken(Type::Filter, loc, pre, post), filter(std::move(filter)) {}